

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void nifti_free_NBL(nifti_brick_list *NBL)

{
  int local_14;
  int c;
  nifti_brick_list *NBL_local;
  
  if (NBL->bricks != (void **)0x0) {
    for (local_14 = 0; local_14 < NBL->nbricks; local_14 = local_14 + 1) {
      if (NBL->bricks[local_14] != (void *)0x0) {
        free(NBL->bricks[local_14]);
      }
    }
    free(NBL->bricks);
    NBL->bricks = (void **)0x0;
  }
  NBL->nbricks = 0;
  NBL->bsize = 0;
  return;
}

Assistant:

void nifti_free_NBL( nifti_brick_list * NBL )
{
   int c;

   if( NBL->bricks ){
      for( c = 0; c < NBL->nbricks; c++ )
         if( NBL->bricks[c] ) free(NBL->bricks[c]);
      free(NBL->bricks);
      NBL->bricks = NULL;
   }

   NBL->bsize = NBL->nbricks = 0;
}